

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::listmaps(int sender)

{
  int iVar1;
  int iVar2;
  char **ppcVar3;
  size_t sVar4;
  char *pcVar5;
  char local_46 [2];
  int local_44;
  int local_40;
  int j;
  int i;
  undefined1 local_30 [8];
  vector<char> line;
  vector<char_*> files;
  int sender_local;
  
  vector<char_*>::vector((vector<char_*> *)&line.alen);
  vector<char>::vector((vector<char> *)local_30);
  listfiles(mappath,"ogz",(vector<char_*> *)&line.alen);
  vector<char_*>::sort((vector<char_*> *)&line.alen);
  iVar1 = vector<char_*>::length((vector<char_*> *)&line.alen);
  pcVar5 = "server has no map files";
  if (iVar1 != 0) {
    pcVar5 = "server map files:";
  }
  sendf(sender,1,"ris",0x23,pcVar5);
  local_40 = 0;
  while (iVar1 = local_40, iVar2 = vector<char_*>::length((vector<char_*> *)&line.alen),
        iVar1 < iVar2) {
    vector<char>::setsize((vector<char> *)local_30,0);
    local_44 = 0;
    for (; iVar1 = local_40, iVar2 = vector<char_*>::length((vector<char_*> *)&line.alen),
        iVar1 < iVar2 && local_44 < 5; local_40 = local_40 + 1) {
      if (local_44 != 0) {
        local_46[1] = 0x20;
        vector<char>::add((vector<char> *)local_30,local_46 + 1);
      }
      ppcVar3 = vector<char_*>::operator[]((vector<char_*> *)&line.alen,local_40);
      pcVar5 = *ppcVar3;
      ppcVar3 = vector<char_*>::operator[]((vector<char_*> *)&line.alen,local_40);
      sVar4 = strlen(*ppcVar3);
      vector<char>::put((vector<char> *)local_30,pcVar5,(int)sVar4);
      local_44 = local_44 + 1;
    }
    local_46[0] = '\0';
    vector<char>::add((vector<char> *)local_30,local_46);
    pcVar5 = vector<char>::getbuf((vector<char> *)local_30);
    sendf(sender,1,"ris",0x23,pcVar5);
  }
  vector<char_*>::deletearrays((vector<char_*> *)&line.alen);
  vector<char>::~vector((vector<char> *)local_30);
  vector<char_*>::~vector((vector<char_*> *)&line.alen);
  return;
}

Assistant:

void listmaps(int sender)
    {
        vector<char *> files;
        vector<char> line;
        listfiles(mappath, "ogz", files);
        files.sort();
        sendf(sender, 1, "ris", N_SERVMSG, files.length() ? "server map files:" : "server has no map files");
        for(int i = 0; i < files.length();)
        {
            line.setsize(0);
            for(int j = 0; i < files.length() && j < 5; i++, j++)
            {
                if(j) line.add(' ');
                line.put(files[i], strlen(files[i]));
            }
            line.add(0);
            sendf(sender, 1, "ris", N_SERVMSG, line.getbuf());
        }
        files.deletearrays();
    }